

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *
assembler::anon_unknown_0::_get_arguments
          (vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
           *__return_storage_ptr__,external_function *f)

{
  value_type vVar1;
  ulong uVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  value_type local_68;
  value_type local_64;
  value_type reg_1;
  value_type reg;
  size_t i_1;
  ulong local_50;
  size_t i;
  int floating_arg_id;
  int regular_arg_id;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> arg_regs;
  external_function *f_local;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *args;
  
  if (((anonymous_namespace)::_get_arguments(assembler::external_function_const&)::arg_reg == '\0')
     && (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                      _get_arguments(assembler::external_function_const&)::arg_reg),
        iVar3 != 0)) {
    get_linux_calling_registers();
    __cxa_atexit(std::
                 vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                 ~vector,&_get_arguments::arg_reg,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::_get_arguments(assembler::external_function_const&)
                         ::arg_reg);
  }
  if (((anonymous_namespace)::_get_arguments(assembler::external_function_const&)::arg_float_reg ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   _get_arguments(assembler::external_function_const&)::
                                   arg_float_reg), iVar3 != 0)) {
    get_floating_point_registers();
    __cxa_atexit(std::
                 vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
                 ~vector,&_get_arguments::arg_float_reg,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::_get_arguments(assembler::external_function_const&)
                         ::arg_float_reg);
  }
  std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::vector
            ((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *)
             &floating_arg_id);
  i._4_4_ = 0;
  i._0_4_ = 0;
  for (local_50 = 0; uVar2 = local_50,
      sVar4 = std::
              vector<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
              ::size(&f->arguments), uVar2 < sVar4; local_50 = local_50 + 1) {
    pvVar5 = std::
             vector<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
             ::operator[](&f->arguments,local_50);
    if (*pvVar5 == T_DOUBLE) {
      pvVar6 = std::
               vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
               operator[](&_get_arguments::arg_float_reg,(long)(int)i);
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      push_back((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *
                )&floating_arg_id,pvVar6);
      i._0_4_ = (int)i + 1;
    }
    else {
      pvVar6 = std::
               vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
               operator[](&_get_arguments::arg_reg,(long)i._4_4_);
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      push_back((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *
                )&floating_arg_id,pvVar6);
      i._4_4_ = i._4_4_ + 1;
    }
  }
  i_1._7_1_ = 0;
  std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::vector
            (__return_storage_ptr__);
  _reg_1 = 0;
  do {
    uVar2 = _reg_1;
    sVar4 = std::
            vector<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
            ::size(&f->arguments);
    if (sVar4 <= uVar2) {
      i_1._7_1_ = 1;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      ~vector((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *)
              &floating_arg_id);
      return __return_storage_ptr__;
    }
    pvVar5 = std::
             vector<assembler::external_function::argtype,_std::allocator<assembler::external_function::argtype>_>
             ::operator[](&f->arguments,_reg_1);
    vVar1 = *pvVar5;
    if (vVar1 < T_DOUBLE) {
LAB_0014ff16:
      pvVar6 = std::
               vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
               operator[]((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                           *)&floating_arg_id,_reg_1);
      local_64 = *pvVar6;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      push_back(__return_storage_ptr__,&local_64);
    }
    else if (vVar1 == T_DOUBLE) {
      pvVar6 = std::
               vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
               operator[]((vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
                           *)&floating_arg_id,_reg_1);
      local_68 = *pvVar6;
      std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
      push_back(__return_storage_ptr__,&local_68);
    }
    else if (vVar1 == T_INT64) goto LAB_0014ff16;
    _reg_1 = _reg_1 + 1;
  } while( true );
}

Assistant:

std::vector<asmcode::operand> _get_arguments(const external_function& f)
    {
#ifdef _WIN32
    static std::vector<asmcode::operand> arg_reg = get_windows_calling_registers();
#else
    static std::vector<asmcode::operand> arg_reg = get_linux_calling_registers();
#endif
    static std::vector<asmcode::operand> arg_float_reg = get_floating_point_registers();
#ifndef _WIN32
    std::vector<asmcode::operand> arg_regs;
    int regular_arg_id = 0;
    int floating_arg_id = 0;
    for (size_t i = 0; i < f.arguments.size(); ++i)
      {
      if (f.arguments[i] == external_function::T_DOUBLE)
        {
        arg_regs.push_back(arg_float_reg[floating_arg_id]);
        ++floating_arg_id;
        }
      else
        {
        arg_regs.push_back(arg_reg[regular_arg_id]);
        ++regular_arg_id;
        }
      }
#endif

    std::vector<asmcode::operand> args;
    for (size_t i = 0; i < f.arguments.size(); ++i)
      {
      switch (f.arguments[i])
        {
        case external_function::T_CHAR_POINTER:
        case external_function::T_INT64:
        case external_function::T_BOOL:
        {
#ifdef _WIN32
        auto reg = arg_reg[i];
#else
        auto reg = arg_regs[i];
#endif
        args.push_back(reg);
        break;
        }
        case external_function::T_DOUBLE:
        {
#ifdef _WIN32
        auto reg = arg_float_reg[i];
#else
        auto reg = arg_regs[i];
#endif
        args.push_back(reg);
        break;
        }
        }
      }
    return args;
    }